

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

wchar_t cmp_for_sort_items(void *left,void *right)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  wchar_t wVar5;
  wchar_t unaff_EBX;
  int iVar6;
  
  iVar1 = *left;
  iVar2 = *right;
  iVar6 = 0;
  do {
    pcVar3 = *(code **)(sort_dat_1 + (long)iVar6 * 0x10);
    if (pcVar3 == (code *)0x0) {
      unaff_EBX = L'\0';
      bVar4 = false;
    }
    else {
      wVar5 = (*pcVar3)(sort_dat_0 + (long)iVar1 * 0x38,sort_dat_0 + (long)iVar2 * 0x38,
                        *(undefined4 *)(sort_dat_1 + (long)iVar6 * 0x10 + 8));
      if (wVar5 == L'\0') {
        iVar6 = iVar6 + 1;
        bVar4 = true;
      }
      else {
        bVar4 = false;
        unaff_EBX = wVar5;
      }
    }
  } while (bVar4);
  return unaff_EBX;
}

Assistant:

static int cmp_for_sort_items(const void *left, const void *right)
{
	int ileft = *((int*) left);
	int iright = *((int*) right);
	int i = 0;

	while (1) {
		int cres;

		if (sort_dat.arr[i].func == 0) {
			return 0;
		}
		cres = (*sort_dat.arr[i].func)(sort_dat.items + ileft,
			sort_dat.items + iright, sort_dat.arr[i].propind);
		if (cres != 0) {
			return cres;
		}
		++i;
	}
}